

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_resampler_init(ma_resampler_config *pConfig,
                           ma_allocation_callbacks *pAllocationCallbacks,ma_resampler *pResampler)

{
  ma_resampler *pResampler_00;
  size_t *in_RDX;
  ma_resampler_config *in_RSI;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_result result;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  ma_result local_4;
  
  local_4 = ma_resampler_get_heap_size(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      pResampler_00 = (ma_resampler *)0x0;
    }
    else {
      pResampler_00 =
           (ma_resampler *)ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x1d3321);
      if (pResampler_00 == (ma_resampler *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    local_4 = ma_resampler_init_preallocated
                        ((ma_resampler_config *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0,pResampler_00);
    if (local_4 == MA_SUCCESS) {
      *(undefined4 *)(in_RDX + 0x17) = 1;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffd0,(ma_allocation_callbacks *)pResampler_00);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_resampler_init(const ma_resampler_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_resampler* pResampler)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_resampler_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_resampler_init_preallocated(pConfig, pHeap, pResampler);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pResampler->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}